

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

void anon_unknown.dwarf_6ac7d::EncodeString<char>
               (DerType type,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
               uchar *out,size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  long lVar2;
  overflow_error *poVar3;
  size_t sVar4;
  length_error *this;
  void *dest;
  void *src;
  size_t count;
  long lVar5;
  size_t offset;
  uchar encodedSize [8];
  size_t cbNeeded;
  size_t cbUsedSize;
  size_t charSize;
  size_t *local_30;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *out_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_local;
  DerType type_local;
  
  local_30 = cbUsed;
  cbUsed_local = (size_t *)cbOut;
  cbOut_local = (size_t)out;
  out_local = (uchar *)in;
  in_local._4_4_ = type;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    if (cbUsed_local < (size_t *)0x2) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"Overflow in EncodeString");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    *(undefined1 *)cbOut_local = 5;
    *(undefined1 *)(cbOut_local + 1) = 0;
    *local_30 = 2;
  }
  else {
    cbUsedSize = 1;
    cbNeeded = 0;
    lVar2 = std::__cxx11::string::size();
    encodedSize = (uchar  [8])(lVar2 + 1);
    sVar4 = std::__cxx11::string::size();
    bVar1 = EncodeSize(sVar4,(uchar *)&offset,8,&cbNeeded);
    if (!bVar1) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"Overflow in EncodeString");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    encodedSize = (uchar  [8])(cbNeeded + (long)encodedSize);
    if (cbUsed_local < (ulong)encodedSize) {
      this = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this,"Insufficient Buffer");
      __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    *(char *)cbOut_local = (char)in_local._4_4_;
    memcpy_s((void *)(cbOut_local + 1),(long)cbUsed_local - 1,&offset,cbNeeded);
    lVar2 = cbNeeded + 1;
    dest = (void *)(cbOut_local + lVar2);
    sVar4 = (long)cbUsed_local - lVar2;
    src = (void *)std::__cxx11::string::operator[]((ulong)out_local);
    count = std::__cxx11::string::size();
    memcpy_s(dest,sVar4,src,count);
    lVar5 = std::__cxx11::string::size();
    *local_30 = lVar2 + lVar5;
  }
  return;
}

Assistant:

void EncodeString(DerType type, const std::basic_string<T>& in, unsigned char* out, size_t cbOut, size_t& cbUsed)
	{
		// If it is empty, encode as Null
		if (in.size() == 0)
		{
			if (cbOut < 2)
				throw std::overflow_error("Overflow in EncodeString");

			out[0] = static_cast<unsigned char>(DerType::Null);
			out[1] = 0;
			cbUsed = 2;
			return;
		}

		const size_t charSize = sizeof(T);
		size_t cbUsedSize = 0;
		size_t cbNeeded = (in.size() + 1) * charSize; // Data, plus tag
		unsigned char encodedSize[sizeof(long long)];

		if (!EncodeSize(in.size() * charSize, encodedSize, sizeof(encodedSize), cbUsedSize))
		{
			throw std::overflow_error("Overflow in EncodeString");
		}

		// Note - cbUsedSize guaranteed to be <= 8, int overflow not possible
		cbNeeded += cbUsedSize;

		if (cbNeeded > cbOut)
			throw std::length_error("Insufficient Buffer");

		out[0] = static_cast<unsigned char>(type);
		size_t offset = 1;
		memcpy_s(out + offset, cbOut - offset, encodedSize, cbUsedSize);
		offset += cbUsedSize;
		memcpy_s(out + offset, cbOut - offset, &in[0], in.size() * charSize);

		cbUsed = offset + in.size() * charSize;
		return;
	}